

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_application_properties(AMQP_VALUE value)

{
  AMQP_VALUE value_00;
  AMQP_VALUE value_01;
  AMQP_VALUE descriptor_00;
  AMQP_VALUE value_02;
  AMQP_VALUE descriptor;
  AMQP_VALUE described_value;
  AMQP_VALUE result;
  AMQP_VALUE value_local;
  
  value_00 = amqpvalue_clone(value);
  if (value_00 == (AMQP_VALUE)0x0) {
    described_value = (AMQP_VALUE)0x0;
  }
  else {
    value_01 = amqpvalue_create_ulong(0x74);
    if (value_01 == (AMQP_VALUE)0x0) {
      described_value = (AMQP_VALUE)0x0;
    }
    else {
      descriptor_00 = amqpvalue_clone(value_01);
      value_02 = amqpvalue_clone(value_00);
      described_value = amqpvalue_create_described(descriptor_00,value_02);
      amqpvalue_destroy(value_01);
    }
    amqpvalue_destroy(value_00);
  }
  return described_value;
}

Assistant:

AMQP_VALUE amqpvalue_create_application_properties(AMQP_VALUE value)
{
    AMQP_VALUE result;
    AMQP_VALUE described_value = amqpvalue_clone(value);
    if (described_value == NULL)
    {
        result = NULL;
    }
    else
    {
        AMQP_VALUE descriptor = amqpvalue_create_ulong(116);
        if (descriptor == NULL)
        {
            result = NULL;
        }
        else
        {
            result = amqpvalue_create_described(amqpvalue_clone(descriptor), amqpvalue_clone(described_value));

            amqpvalue_destroy(descriptor);
        }

        amqpvalue_destroy(described_value);
    }

    return result;
}